

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_xfer_recv(Curl_easy *data,char *buf,size_t blen,ssize_t *pnrcvd)

{
  CURLcode CVar1;
  bool local_2d;
  int sockindex;
  ssize_t *pnrcvd_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  local_2d = false;
  if (data->conn->sockfd != -1) {
    local_2d = data->conn->sockfd == data->conn->sock[1];
  }
  pnrcvd_local = (ssize_t *)blen;
  if ((data->set).buffer_size < blen) {
    pnrcvd_local = (ssize_t *)(ulong)(data->set).buffer_size;
  }
  CVar1 = Curl_conn_recv(data,(uint)local_2d,buf,(size_t)pnrcvd_local,pnrcvd);
  return CVar1;
}

Assistant:

CURLcode Curl_xfer_recv(struct Curl_easy *data,
                        char *buf, size_t blen,
                        ssize_t *pnrcvd)
{
  int sockindex;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  DEBUGASSERT(data->set.buffer_size > 0);

  sockindex = ((data->conn->sockfd != CURL_SOCKET_BAD) &&
               (data->conn->sockfd == data->conn->sock[SECONDARYSOCKET]));
  if((size_t)data->set.buffer_size < blen)
    blen = (size_t)data->set.buffer_size;
  return Curl_conn_recv(data, sockindex, buf, blen, pnrcvd);
}